

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O2

MultiIndexSet *
TasGrid::MultiIndexManipulations::generateNonNestedPoints
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *tensors,
          OneDimensionalWrapper *wrapper)

{
  uint uVar1;
  size_type __n;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __begin3;
  ulong uVar5;
  pointer piVar6;
  int d;
  ulong uVar7;
  long lVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> num_entries;
  vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> point_tensors;
  Data2D<int> raw_points;
  MultiIndexSet local_58;
  
  __n = tensors->num_dimensions;
  uVar1 = tensors->cache_num_indexes;
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::vector
            (&point_tensors,(long)(int)uVar1,(allocator_type *)&raw_points);
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  lVar13 = 0;
  for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&num_entries,__n,(allocator_type *)&raw_points);
    piVar2 = (tensors->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (wrapper->num_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = tensors->num_dimensions * lVar13;
    for (lVar8 = 0; __n * 4 - lVar8 != 0; lVar8 = lVar8 + 4) {
      *(int *)((long)num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar8) =
           piVar9[*(int *)((long)piVar2 + lVar8 + lVar10)];
    }
    uVar12 = 1;
    for (piVar6 = num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      uVar12 = (ulong)(uint)((int)uVar12 * *piVar6);
    }
    Data2D<int>::Data2D<unsigned_long,int>(&raw_points,__n,(int)uVar12);
    piVar9 = raw_points.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (0 < (int)uVar12) {
      uVar12 = (ulong)((int)uVar12 - 1);
      piVar3 = (wrapper->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (wrapper->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = uVar12;
      for (lVar8 = 0; -lVar8 != __n; lVar8 = lVar8 + -1) {
        piVar9[-1] = piVar4[(long)((int)uVar7 %
                                  num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish[lVar8 + -1]) +
                            (long)piVar3[*(int *)((long)piVar2 + lVar8 * 4 + lVar10 + __n * 4 + -4)]
                           ];
        piVar9 = piVar9 + -1;
        uVar7 = (long)(int)uVar7 /
                (long)num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish[lVar8 + -1] & 0xffffffff;
      }
    }
    MultiIndexSet::MultiIndexSet(&local_58,&raw_points);
    MultiIndexSet::operator=
              (point_tensors.
               super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar11,&local_58);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_58.indexes.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&raw_points.vec.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&num_entries);
    lVar13 = lVar13 + 4;
  }
  unionSets(__return_storage_ptr__,&point_tensors);
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::~vector
            (&point_tensors);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet generateNonNestedPoints(const MultiIndexSet &tensors, const OneDimensionalWrapper &wrapper){
    size_t num_dimensions = tensors.getNumDimensions();
    int num_tensors = tensors.getNumIndexes();
    std::vector<MultiIndexSet> point_tensors((size_t) num_tensors);

    #pragma omp parallel for
    for(int t=0; t<num_tensors; t++){
        std::vector<int> num_entries(num_dimensions);
        const int *p = tensors.getIndex(t);
        std::transform(p, p + num_dimensions, num_entries.begin(), [&](int l)->int{ return wrapper.getNumPoints(l); });

        int num_total = 1;
        for(auto &l : num_entries) num_total *= l;

        Data2D<int> raw_points(num_dimensions, num_total);
        auto iter = raw_points.rbegin();
        for(int i=num_total-1; i>=0; i--){
            int d = i;
            auto l = num_entries.rbegin();
            // in order to generate indexes in the correct order, the for loop must go backwards
            for(size_t j = 0; j<num_dimensions; j++){
                *iter++ = wrapper.getPointIndex(p[num_dimensions - j - 1], (d % *l));
                d /= *l++;
            }
        }

        point_tensors[t] = MultiIndexSet(raw_points);
    }

    return unionSets(point_tensors);
}